

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O1

int Ivy_ObjIsInTfi_rec(Ivy_Obj_t *pObjNew,Ivy_Obj_t *pObjOld,int Levels)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = 1;
  if (pObjNew != pObjOld) {
    if ((((Levels != 0) && (uVar2 = *(uint *)&pObjNew->field_0x8 & 0xf, uVar2 != 1)) && (uVar2 != 4)
        ) && (pObjNew->Id != 0)) {
      iVar1 = Ivy_ObjIsInTfi_rec((Ivy_Obj_t *)((ulong)pObjNew->pFanin0 & 0xfffffffffffffffe),pObjOld
                                 ,Levels + -1);
      if (iVar1 != 0) {
        return 1;
      }
      if ((0xfffffffd < uVar2 - 7) &&
         (iVar1 = Ivy_ObjIsInTfi_rec((Ivy_Obj_t *)((ulong)pObjNew->pFanin1 & 0xfffffffffffffffe),
                                     pObjOld,Levels + -1), iVar1 != 0)) {
        return 1;
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int Ivy_ObjIsInTfi_rec( Ivy_Obj_t * pObjNew, Ivy_Obj_t * pObjOld, int Levels )
{
    if ( pObjNew == pObjOld )
        return 1;
    if ( Levels == 0 || Ivy_ObjIsCi(pObjNew) || Ivy_ObjIsConst1(pObjNew) )
        return 0;
    if ( Ivy_ObjIsInTfi_rec( Ivy_ObjFanin0(pObjNew), pObjOld, Levels - 1 ) )
        return 1;
    if ( Ivy_ObjIsNode(pObjNew) && Ivy_ObjIsInTfi_rec( Ivy_ObjFanin1(pObjNew), pObjOld, Levels - 1 ) )
        return 1;
    return 0;
}